

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_tests.cpp
# Opt level: O0

void __thiscall
iu_UnitStringTest_x_iutest_x_OwnStricmp_Test::iu_UnitStringTest_x_iutest_x_OwnStricmp_Test
          (iu_UnitStringTest_x_iutest_x_OwnStricmp_Test *this)

{
  iu_UnitStringTest_x_iutest_x_OwnStricmp_Test *this_local;
  
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__iu_UnitStringTest_x_iutest_x_OwnStricmp_Test_001f21f8;
  return;
}

Assistant:

IUTEST(UnitStringTest, OwnStricmp)
{
    const char negative = static_cast<char>(-1);
    const char negative_sample[] = { 'a', 'a', 'a', negative, '\0' };
    IUTEST_EXPECT_EQ(0, ::iutest::detail::wrapper::iu_stricmp("AAA", "aaa"));
    IUTEST_EXPECT_LT(0, ::iutest::detail::wrapper::iu_stricmp("AAAa", "aaa"));
    IUTEST_EXPECT_LT(0, ::iutest::detail::wrapper::iu_stricmp("AAAB", "aaaa"));
    IUTEST_EXPECT_GT(0, ::iutest::detail::wrapper::iu_stricmp("AAAA", "aaab"));
    IUTEST_EXPECT_GT(0, ::iutest::detail::wrapper::iu_stricmp("AAA", negative_sample));
    IUTEST_EXPECT_GT(0, ::iutest::detail::wrapper::iu_stricmp("AAA", "aaaA"));
}